

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  long lVar1;
  bool bVar2;
  long in_RAX;
  size_t sVar3;
  long lVar4;
  long id_1;
  
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmPolicies.cxx"
                  ,0xe,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  id_1 = in_RAX;
  sVar3 = strlen(id);
  if ((sVar3 == 7) && (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(id,(char (*) [4])"CMP"), bVar2))
  {
    bVar2 = cmHasLiteralSuffix<char_const*,5ul>(id,(char (*) [5])0x52defb);
    if (bVar2) {
      *pid = CMP0000;
      return true;
    }
    lVar4 = 0;
    do {
      if (lVar4 == 4) {
        bVar2 = cmSystemTools::StringToLong(id + 3,&id_1);
        if (!bVar2) {
          return false;
        }
        if (0x3f < id_1) {
          return false;
        }
        *pid = (PolicyID)id_1;
        return true;
      }
      lVar1 = lVar4 + 3;
      lVar4 = lVar4 + 1;
    } while ((int)id[lVar1] - 0x30U < 10);
  }
  return false;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7)
    {
    return false;
    }
  if (!cmHasLiteralPrefix(input, "CMP"))
    {
    return false;
    }
  if (cmHasLiteralSuffix(input, "0000"))
    {
    pid = cmPolicies::CMP0000;
    return true;
    }
  for (int i = 3; i < 7; ++i)
    {
    if (!isdigit(*(input + i)))
      {
      return false;
      }
    }
  long id;
  if (!cmSystemTools::StringToLong(input + 3, &id))
    {
    return false;
    }
  if (id >= cmPolicies::CMPCOUNT)
    {
    return false;
    }
  pid = cmPolicies::PolicyID(id);
  return true;
}